

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  CURLcode CVar1;
  connectdata *in_RAX;
  connectdata *conn;
  
  *asyncp = false;
  conn = in_RAX;
  Curl_free_request_state(data);
  memset(&(data->req).bytecount,0,0xb0);
  *(undefined4 *)&(data->req).size = 0xffffffff;
  *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
  *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
  *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
  *(ushort *)&(data->req).field_0xbb = (ushort)(*(uint *)&(data->set).field_0x8ba >> 0xf) & 0x1000;
  CVar1 = create_conn(data,&conn,asyncp);
  if (CVar1 == CURLE_OK) {
    if (1 < (conn->easyq).size) {
      *protocol_done = true;
      return CURLE_OK;
    }
    if (*asyncp != false) {
      return CURLE_OK;
    }
    CVar1 = Curl_setup_conn(data,protocol_done);
  }
  if (CVar1 == CURLE_NO_CONNECTION_AVAILABLE) {
    CVar1 = CURLE_NO_CONNECTION_AVAILABLE;
  }
  else if (conn != (connectdata *)0x0 && CVar1 != CURLE_OK) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data,conn,true);
    Curl_disconnect(data,conn,true);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.size = data->req.maxdownload = -1;
  data->req.no_body = data->set.opt_no_body;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }

  return result;
}